

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderLoopTests.cpp
# Opt level: O0

int __thiscall
vkt::sr::anon_unknown_0::ShaderLoopTests::init(ShaderLoopTests *this,EVP_PKEY_CTX *ctx)

{
  DataType dataType;
  ShaderType SVar1;
  TestContext *pTVar2;
  undefined8 __s;
  TestNode *node;
  TestNode *node_00;
  ulong extraout_RAX;
  char *__s_00;
  TestNode *pTVar3;
  char *pcVar4;
  char *pcVar5;
  TestNode *node_01;
  char *pcVar6;
  TestNode *node_02;
  ulong uVar7;
  allocator<char> local_5a9;
  string local_5a8;
  allocator<char> local_581;
  string local_580;
  undefined1 local_560 [8];
  MovePtr<vkt::sr::(anonymous_namespace)::ShaderLoopCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderLoopCase>_>
  testCase_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  undefined1 local_4a8 [8];
  string desc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  undefined1 local_440 [8];
  string name;
  bool isVertexCase_1;
  char *shaderTypeName_1;
  ShaderType shaderType_1;
  int shaderTypeNdx_1;
  char *loopCaseName;
  int loopCase;
  allocator<char> local_3d1;
  string local_3d0;
  undefined1 local_3b0 [8];
  MovePtr<vkt::sr::(anonymous_namespace)::ShaderLoopCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderLoopCase>_>
  testCase;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  undefined1 local_298 [8];
  string testDesc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  undefined1 local_1d0 [8];
  string testName;
  bool isVertexCase;
  char *shaderTypeName;
  ShaderType shaderType;
  int shaderTypeNdx;
  char *dataTypeName;
  DataType loopDataType;
  int dataTypeNdx;
  char *precisionName;
  int precision;
  TestCaseGroup *specialSubGroup;
  TestCaseGroup *genericSubGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  undefined1 local_120 [8];
  string groupDesc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  allocator<char> local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  string groupName;
  char *loopCountName;
  int loopCountType;
  char *loopTypeName;
  int loopType;
  TestCaseGroup *specialGroup;
  TestCaseGroup *genericGroup;
  ShaderLoopTests *this_local;
  
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"generic",
             "Generic loop tests.");
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"special"
             ,"Special loop tests.");
  tcu::TestNode::addChild((TestNode *)this,node);
  tcu::TestNode::addChild((TestNode *)this,node_00);
  loopTypeName._4_4_ = LOOPTYPE_FOR;
  uVar7 = extraout_RAX;
  while ((int)loopTypeName._4_4_ < 3) {
    __s_00 = getLoopTypeName(loopTypeName._4_4_);
    for (loopCountName._4_4_ = LOOPCOUNT_CONSTANT; (int)loopCountName._4_4_ < 3;
        loopCountName._4_4_ = loopCountName._4_4_ + LOOPCOUNT_UNIFORM) {
      groupName.field_2._8_8_ = getLoopCountTypeName(loopCountName._4_4_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,__s_00,&local_d1);
      std::operator+(&local_b0,&local_d0,"_");
      __s = groupName.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,(char *)__s,
                 (allocator<char> *)(groupDesc.field_2._M_local_buf + 0xf));
      std::operator+(&local_90,&local_b0,&local_f8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     &local_90,"_iterations");
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_f8);
      std::allocator<char>::~allocator((allocator<char> *)(groupDesc.field_2._M_local_buf + 0xf));
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::allocator<char>::~allocator(&local_d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_160,"Loop tests with ",
                 (allocator<char> *)((long)&genericSubGroup + 7));
      std::operator+(&local_140,&local_160,(char *)groupName.field_2._8_8_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                     &local_140," loop counter.");
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_160);
      std::allocator<char>::~allocator((allocator<char> *)((long)&genericSubGroup + 7));
      pTVar3 = (TestNode *)operator_new(0x70);
      pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
      pcVar4 = (char *)std::__cxx11::string::c_str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar3,pTVar2,pcVar4,pcVar5);
      node_01 = (TestNode *)operator_new(0x70);
      pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
      pcVar4 = (char *)std::__cxx11::string::c_str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)node_01,pTVar2,pcVar4,pcVar5);
      tcu::TestNode::addChild(node,pTVar3);
      tcu::TestNode::addChild(node_00,node_01);
      for (precisionName._4_4_ = PRECISION_MEDIUMP; (int)precisionName._4_4_ < 3;
          precisionName._4_4_ = precisionName._4_4_ + PRECISION_MEDIUMP) {
        pcVar4 = glu::getPrecisionName(precisionName._4_4_);
        for (dataTypeName._4_4_ = 0; dataTypeName._4_4_ < 2;
            dataTypeName._4_4_ = dataTypeName._4_4_ + 1) {
          dataType = init::s_countDataType[dataTypeName._4_4_];
          pcVar5 = glu::getDataTypeName(dataType);
          for (shaderTypeName._4_4_ = 0; shaderTypeName._4_4_ < 2;
              shaderTypeName._4_4_ = shaderTypeName._4_4_ + 1) {
            SVar1 = init::s_shaderTypes[shaderTypeName._4_4_];
            pcVar6 = glu::getShaderTypeName(SVar1);
            testName.field_2._M_local_buf[0xf] = SVar1 == SHADERTYPE_VERTEX;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_270,"basic_",
                       (allocator<char> *)(testDesc.field_2._M_local_buf + 0xf));
            std::operator+(&local_250,&local_270,pcVar4);
            std::operator+(&local_230,&local_250,"_");
            std::operator+(&local_210,&local_230,pcVar5);
            std::operator+(&local_1f0,&local_210,"_");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1d0,&local_1f0,pcVar6);
            std::__cxx11::string::~string((string *)&local_1f0);
            std::__cxx11::string::~string((string *)&local_210);
            std::__cxx11::string::~string((string *)&local_230);
            std::__cxx11::string::~string((string *)&local_250);
            std::__cxx11::string::~string((string *)&local_270);
            std::allocator<char>::~allocator
                      ((allocator<char> *)(testDesc.field_2._M_local_buf + 0xf));
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_398,__s_00,
                       (allocator<char> *)
                       &testCase.
                        super_UniqueBase<vkt::sr::(anonymous_namespace)::ShaderLoopCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderLoopCase>_>
                        .m_data.field_0xf);
            std::operator+(&local_378,&local_398," loop with ");
            std::operator+(&local_358,&local_378,pcVar4);
            std::operator+(&local_338,&local_358,pcVar5);
            std::operator+(&local_318,&local_338," ");
            std::operator+(&local_2f8,&local_318,(char *)groupName.field_2._8_8_);
            std::operator+(&local_2d8,&local_2f8," iteration count in ");
            std::operator+(&local_2b8,&local_2d8,pcVar6);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_298,&local_2b8," shader.");
            std::__cxx11::string::~string((string *)&local_2b8);
            std::__cxx11::string::~string((string *)&local_2d8);
            std::__cxx11::string::~string((string *)&local_2f8);
            std::__cxx11::string::~string((string *)&local_318);
            std::__cxx11::string::~string((string *)&local_338);
            std::__cxx11::string::~string((string *)&local_358);
            std::__cxx11::string::~string((string *)&local_378);
            std::__cxx11::string::~string((string *)&local_398);
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       &testCase.
                        super_UniqueBase<vkt::sr::(anonymous_namespace)::ShaderLoopCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderLoopCase>_>
                        .m_data.field_0xf);
            pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
            pcVar6 = (char *)std::__cxx11::string::c_str();
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3d0,pcVar6,&local_3d1);
            pcVar6 = (char *)std::__cxx11::string::c_str();
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&loopCase,pcVar6,(allocator<char> *)((long)&loopCaseName + 7));
            createGenericLoopCase
                      ((MovePtr<vkt::sr::(anonymous_namespace)::ShaderLoopCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderLoopCase>_>
                        *)local_3b0,pTVar2,&local_3d0,(string *)&loopCase,
                       (bool)(testName.field_2._M_local_buf[0xf] & 1),loopTypeName._4_4_,
                       loopCountName._4_4_,precisionName._4_4_,dataType);
            std::__cxx11::string::~string((string *)&loopCase);
            std::allocator<char>::~allocator((allocator<char> *)((long)&loopCaseName + 7));
            std::__cxx11::string::~string((string *)&local_3d0);
            std::allocator<char>::~allocator(&local_3d1);
            node_02 = (TestNode *)
                      de::details::
                      MovePtr<vkt::sr::(anonymous_namespace)::ShaderLoopCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderLoopCase>_>
                      ::release((MovePtr<vkt::sr::(anonymous_namespace)::ShaderLoopCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderLoopCase>_>
                                 *)local_3b0);
            tcu::TestNode::addChild(pTVar3,node_02);
            de::details::
            MovePtr<vkt::sr::(anonymous_namespace)::ShaderLoopCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderLoopCase>_>
            ::~MovePtr((MovePtr<vkt::sr::(anonymous_namespace)::ShaderLoopCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderLoopCase>_>
                        *)local_3b0);
            std::__cxx11::string::~string((string *)local_298);
            std::__cxx11::string::~string((string *)local_1d0);
          }
        }
      }
      for (loopCaseName._0_4_ = LOOPCASE_EMPTY_BODY; (int)(LoopCase)loopCaseName < 0x1a;
          loopCaseName._0_4_ =
               (LoopCase)loopCaseName + LOOPCASE_INFINITE_WITH_UNCONDITIONAL_BREAK_FIRST) {
        pcVar4 = getLoopCaseName((LoopCase)loopCaseName);
        if (((LoopCase)loopCaseName != LOOPCASE_NO_ITERATIONS) ||
           (loopTypeName._4_4_ != LOOPTYPE_DO_WHILE)) {
          for (shaderTypeName_1._4_4_ = 0; shaderTypeName_1._4_4_ < 2;
              shaderTypeName_1._4_4_ = shaderTypeName_1._4_4_ + 1) {
            SVar1 = init::s_shaderTypes[shaderTypeName_1._4_4_];
            pcVar5 = glu::getShaderTypeName(SVar1);
            name.field_2._M_local_buf[0xf] = SVar1 == SHADERTYPE_VERTEX;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_480,pcVar4,
                       (allocator<char> *)(desc.field_2._M_local_buf + 0xf));
            std::operator+(&local_460,&local_480,"_");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_440,&local_460,pcVar5);
            std::__cxx11::string::~string((string *)&local_460);
            std::__cxx11::string::~string((string *)&local_480);
            std::allocator<char>::~allocator((allocator<char> *)(desc.field_2._M_local_buf + 0xf));
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_548,pcVar4,
                       (allocator<char> *)
                       &testCase_1.
                        super_UniqueBase<vkt::sr::(anonymous_namespace)::ShaderLoopCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderLoopCase>_>
                        .m_data.field_0xf);
            std::operator+(&local_528,&local_548," loop with ");
            std::operator+(&local_508,&local_528,__s_00);
            std::operator+(&local_4e8,&local_508," iteration count in ");
            std::operator+(&local_4c8,&local_4e8,pcVar5);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4a8,&local_4c8," shader.");
            std::__cxx11::string::~string((string *)&local_4c8);
            std::__cxx11::string::~string((string *)&local_4e8);
            std::__cxx11::string::~string((string *)&local_508);
            std::__cxx11::string::~string((string *)&local_528);
            std::__cxx11::string::~string((string *)&local_548);
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       &testCase_1.
                        super_UniqueBase<vkt::sr::(anonymous_namespace)::ShaderLoopCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderLoopCase>_>
                        .m_data.field_0xf);
            pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
            pcVar5 = (char *)std::__cxx11::string::c_str();
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_580,pcVar5,&local_581);
            pcVar5 = (char *)std::__cxx11::string::c_str();
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_5a8,pcVar5,&local_5a9);
            createSpecialLoopCase
                      ((MovePtr<vkt::sr::(anonymous_namespace)::ShaderLoopCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderLoopCase>_>
                        *)local_560,pTVar2,&local_580,&local_5a8,
                       (bool)(name.field_2._M_local_buf[0xf] & 1),(LoopCase)loopCaseName,
                       loopTypeName._4_4_,loopCountName._4_4_);
            std::__cxx11::string::~string((string *)&local_5a8);
            std::allocator<char>::~allocator(&local_5a9);
            std::__cxx11::string::~string((string *)&local_580);
            std::allocator<char>::~allocator(&local_581);
            pTVar3 = (TestNode *)
                     de::details::
                     MovePtr<vkt::sr::(anonymous_namespace)::ShaderLoopCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderLoopCase>_>
                     ::release((MovePtr<vkt::sr::(anonymous_namespace)::ShaderLoopCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderLoopCase>_>
                                *)local_560);
            tcu::TestNode::addChild(node_01,pTVar3);
            de::details::
            MovePtr<vkt::sr::(anonymous_namespace)::ShaderLoopCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderLoopCase>_>
            ::~MovePtr((MovePtr<vkt::sr::(anonymous_namespace)::ShaderLoopCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderLoopCase>_>
                        *)local_560);
            std::__cxx11::string::~string((string *)local_4a8);
            std::__cxx11::string::~string((string *)local_440);
          }
        }
      }
      std::__cxx11::string::~string((string *)local_120);
      std::__cxx11::string::~string((string *)local_70);
    }
    loopTypeName._4_4_ = loopTypeName._4_4_ + LOOPTYPE_WHILE;
    uVar7 = (ulong)loopTypeName._4_4_;
  }
  return (int)uVar7;
}

Assistant:

void ShaderLoopTests::init (void)
{
	// Loop cases.

	static const glu::ShaderType s_shaderTypes[] =
	{
		glu::SHADERTYPE_VERTEX,
		glu::SHADERTYPE_FRAGMENT
	};

	static const glu::DataType s_countDataType[] =
	{
		glu::TYPE_INT,
		glu::TYPE_FLOAT
	};

	TestCaseGroup* genericGroup = new TestCaseGroup(m_testCtx, "generic", "Generic loop tests.");
	TestCaseGroup* specialGroup = new TestCaseGroup(m_testCtx, "special", "Special loop tests.");
	addChild(genericGroup);
	addChild(specialGroup);

	for (int loopType = 0; loopType < LOOPTYPE_LAST; loopType++)
	{
		const char* loopTypeName = getLoopTypeName((LoopType)loopType);

		for (int loopCountType = 0; loopCountType < LOOPCOUNT_LAST; loopCountType++)
		{
			const char* loopCountName = getLoopCountTypeName((LoopCountType)loopCountType);

			std::string groupName = std::string(loopTypeName) + "_" + std::string(loopCountName) + "_iterations";
			std::string groupDesc = std::string("Loop tests with ") + loopCountName + " loop counter.";
			TestCaseGroup* genericSubGroup = new TestCaseGroup(m_testCtx, groupName.c_str(), groupDesc.c_str());
			TestCaseGroup* specialSubGroup = new TestCaseGroup(m_testCtx, groupName.c_str(), groupDesc.c_str());
			genericGroup->addChild(genericSubGroup);
			specialGroup->addChild(specialSubGroup);

			// Generic cases.

			for (int precision = glu::PRECISION_MEDIUMP; precision < glu::PRECISION_LAST; precision++)
			{
				const char* precisionName = getPrecisionName((glu::Precision)precision);

				for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_countDataType); dataTypeNdx++)
				{
					glu::DataType loopDataType = s_countDataType[dataTypeNdx];
					const char* dataTypeName = getDataTypeName(loopDataType);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						glu::ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
						const char*	shaderTypeName	= getShaderTypeName(shaderType);
						bool		isVertexCase	= (shaderType == glu::SHADERTYPE_VERTEX);

						std::string testName = std::string("basic_") + precisionName + "_" + dataTypeName + "_" + shaderTypeName;
						std::string testDesc = std::string(loopTypeName) + " loop with " + precisionName + dataTypeName + " " + loopCountName + " iteration count in " + shaderTypeName + " shader.";
						de::MovePtr<ShaderLoopCase> testCase(createGenericLoopCase(m_testCtx, testName.c_str(), testDesc.c_str(), isVertexCase, (LoopType)loopType, (LoopCountType)loopCountType, (glu::Precision)precision, loopDataType));
						genericSubGroup->addChild(testCase.release());
					}
				}
			}

			// Special cases.

			for (int loopCase = 0; loopCase < LOOPCASE_LAST; loopCase++)
			{
				const char* loopCaseName = getLoopCaseName((LoopCase)loopCase);

				// no-iterations not possible with do-while.
				if ((loopCase == LOOPCASE_NO_ITERATIONS) && (loopType == LOOPTYPE_DO_WHILE))
					continue;

				for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
				{
					glu::ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
					const char*	shaderTypeName	= getShaderTypeName(shaderType);
					bool		isVertexCase	= (shaderType == glu::SHADERTYPE_VERTEX);

					std::string name = std::string(loopCaseName) + "_" + shaderTypeName;
					std::string desc = std::string(loopCaseName) + " loop with " + loopTypeName + " iteration count in " + shaderTypeName + " shader.";
					de::MovePtr<ShaderLoopCase> testCase(createSpecialLoopCase(m_testCtx, name.c_str(), desc.c_str(), isVertexCase, (LoopCase)loopCase, (LoopType)loopType, (LoopCountType)loopCountType));
					specialSubGroup->addChild(testCase.release());
				}
			}
		}
	}
}